

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_win_unpart(ggml_context *ctx,ggml_tensor *a,int w0,int h0,int w)

{
  ggml_tensor *tensor;
  ggml_tensor *in_RSI;
  undefined4 in_R8D;
  int32_t params [1];
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffffa8;
  ggml_type in_stack_ffffffffffffffac;
  ggml_context *in_stack_ffffffffffffffb0;
  
  if (in_RSI->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1224,"GGML_ASSERT(%s) failed","a->type == GGML_TYPE_F32");
  }
  tensor = ggml_new_tensor(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa8,(int64_t *)0x152827);
  ggml_set_op_params(tensor,(void *)CONCAT44(in_R8D,in_stack_ffffffffffffffa8),0x152848);
  tensor->op = GGML_OP_WIN_UNPART;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_win_unpart(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   w0,
        int                   h0,
        int                   w) {
    GGML_ASSERT(a->type == GGML_TYPE_F32);

    const int64_t ne[4] = { a->ne[0], w0, h0, 1, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 3, ne);

    int32_t params[] = { w };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_WIN_UNPART;
    result->src[0] = a;

    return result;
}